

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::WriteXML(cmCTestLaunch *this)

{
  allocator local_2c9;
  cmXMLWriter xml;
  string logXML;
  string local_278;
  cmGeneratedFileStream fxml;
  
  std::__cxx11::string::string((string *)&logXML,(string *)&this->LogDir);
  std::__cxx11::string::append((char *)&logXML);
  std::__cxx11::string::append((string *)&logXML);
  std::__cxx11::string::append((char *)&logXML);
  cmGeneratedFileStream::cmGeneratedFileStream(&fxml,logXML._M_dataplus._M_p,false);
  cmXMLWriter::cmXMLWriter(&xml,(ostream *)&fxml,2);
  std::__cxx11::string::string((string *)&local_278,"Failure",&local_2c9);
  cmXMLWriter::StartElement(&xml,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  local_278._M_dataplus._M_p = "Error";
  if (this->ExitCode == 0) {
    local_278._M_dataplus._M_p = "Warning";
  }
  cmXMLWriter::Attribute<char_const*>(&xml,"type",(char **)&local_278);
  WriteXMLAction(this,&xml);
  WriteXMLCommand(this,&xml);
  WriteXMLResult(this,&xml);
  WriteXMLLabels(this,&xml);
  cmXMLWriter::EndElement(&xml);
  cmXMLWriter::~cmXMLWriter(&xml);
  cmGeneratedFileStream::~cmGeneratedFileStream(&fxml);
  std::__cxx11::string::~string((string *)&logXML);
  return;
}

Assistant:

void cmCTestLaunch::WriteXML()
{
  // Name the xml file.
  std::string logXML = this->LogDir;
  logXML += this->IsError()? "error-" : "warning-";
  logXML += this->LogHash;
  logXML += ".xml";

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML.c_str());
  cmXMLWriter xml(fxml, 2);
  xml.StartElement("Failure");
  xml.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(xml);
  this->WriteXMLCommand(xml);
  this->WriteXMLResult(xml);
  this->WriteXMLLabels(xml);
  xml.EndElement(); // Failure
}